

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall gl4cts::DirectStateAccess::Textures::CopyTest::Test<3u>(CopyTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  GLuint i;
  int zoffset;
  byte bVar5;
  
  CreateAll<3u>(this);
  bVar5 = 1;
  for (zoffset = 0; zoffset != 4; zoffset = zoffset + 1) {
    bVar1 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,0,0,zoffset,0,0,2,2);
    bVar2 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,2,0,zoffset,2,0,2,2);
    bVar3 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,0,2,zoffset,0,2,2,2);
    bVar4 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,2,2,zoffset,2,2,2,2);
    bVar5 = bVar5 & ((bVar4 && bVar3) && (bVar2 && bVar1));
  }
  bVar1 = CheckData(this,0x806f,0x100);
  CleanAll(this);
  return (bool)(bVar1 & bVar5);
}

Assistant:

bool CopyTest::Test<3>()
{
	CreateAll<3>();

	bool result = true;

	for (glw::GLuint i = 0; i < s_texture_depth; ++i)
	{
		result &=
			CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, 0, 0, i, 0, 0, s_texture_width / 2, s_texture_height / 2);
		result &= CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, s_texture_width / 2, 0, i, s_texture_width / 2, 0,
													  s_texture_width / 2, s_texture_height / 2);
		result &= CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, 0, s_texture_height / 2, i, 0, s_texture_height / 2,
													  s_texture_width / 2, s_texture_height / 2);
		result &= CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, s_texture_width / 2, s_texture_height / 2, i,
													  s_texture_width / 2, s_texture_height / 2, s_texture_width / 2,
													  s_texture_height / 2);
	}

	result &= CheckData(TextureTarget<3>(), 4 /* RGBA */ * s_texture_width * s_texture_height * s_texture_depth);

	CleanAll();

	return result;
}